

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Demangle.cpp
# Opt level: O3

bool WTF::ParseBareFunctionType(State *state)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  undefined2 local_3a;
  undefined6 uStack_38;
  
  pcVar2 = state->mangled_cur;
  pcVar3 = state->out_cur;
  pcVar4 = state->out_begin;
  pcVar5 = state->out_end;
  uVar6 = *(undefined8 *)((long)&state->prev_name + 6);
  uStack_38 = (undefined6)((ulong)*(undefined8 *)((long)&state->out_end + 6) >> 0x10);
  local_3a = (undefined2)((ulong)pcVar5 >> 0x30);
  bVar1 = state->append;
  bVar8 = state->overflowed;
  state->append = false;
  bVar7 = ParseType(state);
  if (bVar7) {
    do {
      bVar8 = ParseType(state);
    } while (bVar8);
    state->append = (bool)(bVar1 & 1);
    MaybeAppend(state,"()");
  }
  else {
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_38,local_3a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar6;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->append = bVar1;
    state->overflowed = bVar8;
  }
  return bVar7;
}

Assistant:

static bool ParseBareFunctionType(State *state) {
  State copy = *state;
  DisableAppend(state);
  if (OneOrMore(ParseType, state)) {
    RestoreAppend(state, copy.append);
    MaybeAppend(state, "()");
    return true;
  }
  *state = copy;
  return false;
}